

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

VkFramebuffer __thiscall
Diligent::FramebufferCache::GetFramebuffer
          (FramebufferCache *this,FramebufferCacheKey *Key,uint32_t width,uint32_t height,
          uint32_t layers)

{
  value_type pVVar1;
  bool bVar2;
  pointer ppVar3;
  reference ppVVar4;
  VulkanLogicalDevice *this_00;
  Char *Message;
  __enable_if_t<is_constructible<value_type,_pair<FramebufferCacheKey,_VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanHandleTypeId)13>_>_&&>::value,_pair<iterator,_bool>_>
  _Var5;
  uint local_204;
  Uint32 rt_1;
  undefined1 local_1e8 [8];
  string msg;
  pair<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>
  local_1b8;
  _Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
  local_130;
  __enable_if_t<is_constructible<value_type,_pair<FramebufferCacheKey,_VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanHandleTypeId)13>_>_&&>::value,_pair<iterator,_bool>_>
  new_it;
  VkFramebuffer fb;
  FramebufferWrapper Framebuffer;
  Uint32 rt;
  uint32_t *attachment;
  array<VkImageView_T_*,_10UL> Attachments;
  VkFramebufferCreateInfo FramebufferCI;
  _Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
  local_58 [3];
  _Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
  local_40;
  iterator it;
  lock_guard<std::mutex> Lock;
  uint32_t layers_local;
  uint32_t height_local;
  uint32_t width_local;
  FramebufferCacheKey *Key_local;
  FramebufferCache *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->m_Mutex);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
       ::find(&this->m_Cache,Key);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
       ::end(&this->m_Cache);
  bVar2 = std::__detail::operator!=(&local_40,local_58);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_false,_true>
                           *)&local_40);
    this_local = (FramebufferCache *)
                 VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkFramebuffer_T_
                           ((VulkanObjectWrapper *)&ppVar3->second);
  }
  else {
    memset(Attachments._M_elems + 9,0,0x40);
    Attachments._M_elems[9]._0_4_ = 0x25;
    if (Key->DSV != (VkImageView)0x0) {
      pVVar1 = Key->DSV;
      ppVVar4 = std::array<VkImageView_T_*,_10UL>::operator[]
                          ((array<VkImageView_T_*,_10UL> *)&attachment,
                           (ulong)(uint)FramebufferCI.renderPass);
      *ppVVar4 = pVVar1;
      FramebufferCI.renderPass._0_4_ = (uint)FramebufferCI.renderPass + 1;
    }
    for (Framebuffer.m_VkObject._4_4_ = 0; Framebuffer.m_VkObject._4_4_ < Key->NumRenderTargets;
        Framebuffer.m_VkObject._4_4_ = Framebuffer.m_VkObject._4_4_ + 1) {
      if (Key->RTVs[Framebuffer.m_VkObject._4_4_] != (VkImageView)0x0) {
        pVVar1 = Key->RTVs[Framebuffer.m_VkObject._4_4_];
        ppVVar4 = std::array<VkImageView_T_*,_10UL>::operator[]
                            ((array<VkImageView_T_*,_10UL> *)&attachment,
                             (ulong)(uint)FramebufferCI.renderPass);
        *ppVVar4 = pVVar1;
        FramebufferCI.renderPass._0_4_ = (uint)FramebufferCI.renderPass + 1;
      }
    }
    if (Key->ShadingRate != (VkImageView)0x0) {
      pVVar1 = Key->ShadingRate;
      ppVVar4 = std::array<VkImageView_T_*,_10UL>::operator[]
                          ((array<VkImageView_T_*,_10UL> *)&attachment,
                           (ulong)(uint)FramebufferCI.renderPass);
      *ppVVar4 = pVVar1;
    }
    std::array<VkImageView_T_*,_10UL>::data((array<VkImageView_T_*,_10UL> *)&attachment);
    this_00 = RenderDeviceVkImpl::GetLogicalDevice(this->m_DeviceVk);
    VulkanUtilities::VulkanLogicalDevice::CreateFramebuffer
              ((FramebufferWrapper *)&fb,this_00,
               (VkFramebufferCreateInfo *)(Attachments._M_elems + 9),"");
    new_it._8_8_ = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkFramebuffer_T_
                             ((VulkanObjectWrapper *)&fb);
    std::
    make_pair<Diligent::FramebufferCache::FramebufferCacheKey_const&,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>
              (&local_1b8,Key,
               (VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13> *)
               &fb);
    _Var5 = std::
            unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>>
            ::
            insert<std::pair<Diligent::FramebufferCache::FramebufferCacheKey,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>
                      ((unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>,Diligent::FramebufferCache::FramebufferCacheKeyHash,std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,std::allocator<std::pair<Diligent::FramebufferCache::FramebufferCacheKey_const,VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T*,(VulkanUtilities::VulkanHandleTypeId)13>>>>
                        *)&this->m_Cache,&local_1b8);
    msg.field_2._8_8_ =
         _Var5.first.
         super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
         ._M_cur;
    new_it.first.
    super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
    ._M_cur._0_1_ = _Var5.second;
    local_130._M_cur = (__node_type *)msg.field_2._8_8_;
    std::
    pair<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>
    ::~pair(&local_1b8);
    if (((byte)new_it.first.
               super__Node_iterator_base<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>,_true>
               ._M_cur & 1) == 0) {
      FormatString<char[46]>
                ((string *)local_1e8,(char (*) [46])"New framebuffer must be inserted into the map")
      ;
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
                 ,0x7c);
      std::__cxx11::string::~string((string *)local_1e8);
    }
    std::
    unordered_multimap<VkRenderPass_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkRenderPass_T*>,std::equal_to<VkRenderPass_T*>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
    ::emplace<VkRenderPass_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
              ((unordered_multimap<VkRenderPass_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkRenderPass_T*>,std::equal_to<VkRenderPass_T*>,std::allocator<std::pair<VkRenderPass_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
                *)&this->m_RenderPassToKeyMap,&Key->Pass,Key);
    if (Key->DSV != (VkImageView)0x0) {
      std::
      unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
      ::emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                ((unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
                  *)&this->m_ViewToKeyMap,&Key->DSV,Key);
    }
    if (Key->ShadingRate != (VkImageView)0x0) {
      std::
      unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
      ::emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                ((unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
                  *)&this->m_ViewToKeyMap,&Key->ShadingRate,Key);
    }
    for (local_204 = 0; local_204 < Key->NumRenderTargets; local_204 = local_204 + 1) {
      if (Key->RTVs[local_204] != (VkImageView)0x0) {
        std::
        unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
        ::emplace<VkImageView_T*const&,Diligent::FramebufferCache::FramebufferCacheKey_const&>
                  ((unordered_multimap<VkImageView_T*,Diligent::FramebufferCache::FramebufferCacheKey,std::hash<VkImageView_T*>,std::equal_to<VkImageView_T*>,std::allocator<std::pair<VkImageView_T*const,Diligent::FramebufferCache::FramebufferCacheKey>>>
                    *)&this->m_ViewToKeyMap,Key->RTVs + local_204,Key);
      }
    }
    this_local = (FramebufferCache *)new_it._8_8_;
    VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>
    ::~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13> *)
               &fb);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (VkFramebuffer)this_local;
}

Assistant:

VkFramebuffer FramebufferCache::GetFramebuffer(const FramebufferCacheKey& Key, uint32_t width, uint32_t height, uint32_t layers)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};

    auto it = m_Cache.find(Key);
    if (it != m_Cache.end())
    {
        return it->second;
    }
    else
    {
        VkFramebufferCreateInfo FramebufferCI{};
        FramebufferCI.sType      = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        FramebufferCI.pNext      = nullptr;
        FramebufferCI.flags      = 0; // reserved for future use
        FramebufferCI.renderPass = Key.Pass;

        std::array<VkImageView, 2 + MAX_RENDER_TARGETS> Attachments;

        uint32_t& attachment = FramebufferCI.attachmentCount;
        if (Key.DSV != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.DSV;

        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
        {
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                Attachments[attachment++] = Key.RTVs[rt];
        }

        if (Key.ShadingRate != VK_NULL_HANDLE)
            Attachments[attachment++] = Key.ShadingRate;

        FramebufferCI.pAttachments = Attachments.data();
        FramebufferCI.width        = width;
        FramebufferCI.height       = height;
        FramebufferCI.layers       = layers;

        VulkanUtilities::FramebufferWrapper Framebuffer = m_DeviceVk.GetLogicalDevice().CreateFramebuffer(FramebufferCI);

        VkFramebuffer fb = Framebuffer;

        auto new_it = m_Cache.insert(std::make_pair(Key, std::move(Framebuffer)));
        VERIFY(new_it.second, "New framebuffer must be inserted into the map");
        (void)new_it;

        m_RenderPassToKeyMap.emplace(Key.Pass, Key);
        if (Key.DSV != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.DSV, Key);
        if (Key.ShadingRate != VK_NULL_HANDLE)
            m_ViewToKeyMap.emplace(Key.ShadingRate, Key);
        for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            if (Key.RTVs[rt] != VK_NULL_HANDLE)
                m_ViewToKeyMap.emplace(Key.RTVs[rt], Key);

        return fb;
    }
}